

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

bool common_chat_verify_template(string *tmpl,bool use_jinja)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined7 in_register_00000031;
  bool bVar3;
  common_chat_templates_ptr tmpls;
  common_chat_templates_inputs inputs;
  llama_chat_message chat [1];
  common_chat_templates *local_2e0;
  undefined1 local_2d8 [24];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined2 local_280;
  undefined1 local_278 [29];
  bool local_25b;
  common_chat_msg local_258;
  common_chat_msg local_188;
  common_chat_params local_b8;
  
  if ((int)CONCAT71(in_register_00000031,use_jinja) == 0) {
    local_188.role._M_dataplus._M_p = "user";
    local_188.role._M_string_length = 0x219144;
    iVar2 = llama_chat_apply_template((tmpl->_M_dataplus)._M_p,&local_188,1,1,0,0);
    bVar3 = -1 < iVar2;
  }
  else {
    local_188.role._M_dataplus._M_p = (pointer)&local_188.role.field_2;
    local_188.role._M_string_length = 0;
    local_188.role.field_2._M_local_buf[0] = '\0';
    local_188.content._M_dataplus._M_p = (pointer)&local_188.content.field_2;
    local_188.content._M_string_length = 0;
    local_188.content.field_2._M_local_buf[0] = '\0';
    local_188.reasoning_content._M_dataplus._M_p = (pointer)&local_188.reasoning_content.field_2;
    local_188.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.tool_calls.
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.tool_calls.
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.tool_calls.
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.reasoning_content._M_string_length = 0;
    local_188.reasoning_content.field_2._M_local_buf[0] = '\0';
    local_188.tool_name._M_dataplus._M_p = (pointer)&local_188.tool_name.field_2;
    local_188.tool_name._M_string_length = 0;
    local_188.tool_name.field_2._M_local_buf[0] = '\0';
    local_188.tool_call_id._M_dataplus._M_p = (pointer)&local_188.tool_call_id.field_2;
    local_188.tool_call_id._M_string_length = 0;
    local_188.tool_call_id.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,0x21eef7);
    std::__cxx11::string::_M_replace
              ((ulong)&local_188.content,0,(char *)local_188.content._M_string_length,0x219144);
    paVar1 = &local_258.role.field_2;
    local_258.role._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
    local_2d8._0_8_ = (pointer)(local_2d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8);
    common_chat_templates_init((llama_model *)&local_2e0,(string *)0x0,tmpl,&local_258.role);
    if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
      operator_delete((void *)local_2d8._0_8_,
                      (ulong)((long)&(((string *)local_2d8._16_8_)->_M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.role._M_dataplus._M_p != paVar1) {
      operator_delete(local_258.role._M_dataplus._M_p,
                      local_258.role.field_2._M_allocated_capacity + 1);
    }
    local_2d8._16_8_ = (pointer)0x0;
    local_2d8._0_8_ = (pointer)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = '\0';
    local_298 = 0;
    local_290._M_local_buf[0] = '\0';
    local_280._0_1_ = true;
    local_280._1_1_ = true;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_5_ = 0;
    local_278._13_3_ = 0;
    local_278._16_5_ = 0;
    local_278._21_8_ = 0;
    local_25b = true;
    local_2c0._M_p = (pointer)&local_2b0;
    local_2a0._M_p = (pointer)&local_290;
    common_chat_msg::common_chat_msg(&local_258,&local_188);
    std::vector<common_chat_msg,std::allocator<common_chat_msg>>::
    _M_assign_aux<common_chat_msg_const*>
              ((vector<common_chat_msg,std::allocator<common_chat_msg>> *)local_2d8,&local_258,
               &local_188);
    common_chat_msg::~common_chat_msg(&local_258);
    common_chat_templates_apply(&local_b8,local_2e0,(common_chat_templates_inputs *)local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8.additional_stops);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8.preserved_tokens);
    std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
              (&local_b8.grammar_triggers);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.grammar._M_dataplus._M_p != &local_b8.grammar.field_2) {
      operator_delete(local_b8.grammar._M_dataplus._M_p,
                      local_b8.grammar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.prompt._M_dataplus._M_p != &local_b8.prompt.field_2) {
      operator_delete(local_b8.prompt._M_dataplus._M_p,
                      local_b8.prompt.field_2._M_allocated_capacity + 1);
    }
    std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::~vector
              ((vector<common_chat_tool,_std::allocator<common_chat_tool>_> *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_p != &local_290) {
      operator_delete(local_2a0._M_p,
                      CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_p != &local_2b0) {
      operator_delete(local_2c0._M_p,
                      CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1)
      ;
    }
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_2d8);
    if (local_2e0 != (common_chat_templates *)0x0) {
      common_chat_templates_free(local_2e0);
    }
    common_chat_msg::~common_chat_msg(&local_188);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool common_chat_verify_template(const std::string & tmpl, bool use_jinja) {
    if (use_jinja) {
        try {
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "test";

            auto tmpls = common_chat_templates_init(/* model= */ nullptr, tmpl);

            common_chat_templates_inputs inputs;
            inputs.messages = {msg};

            common_chat_templates_apply(tmpls.get(), inputs);
            return true;
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to apply template: %s\n", __func__, e.what());
            return false;
        }
    }
    llama_chat_message chat[] = {{"user", "test"}};
    const int res = llama_chat_apply_template(tmpl.c_str(), chat, 1, true, nullptr, 0);
    return res >= 0;
}